

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factorgraph.h
# Opt level: O0

size_t __thiscall libDAI::FactorGraph::findVar(FactorGraph *this,Var *n)

{
  const_iterator __first;
  const_iterator __last;
  size_t sVar1;
  __normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
  *in_RDI;
  size_t i;
  vector<libDAI::Var,_std::allocator<libDAI::Var>_> *in_stack_ffffffffffffffb8;
  Var *in_stack_ffffffffffffffc8;
  
  (*(code *)in_RDI->_M_current[3]._states)();
  __first = std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::begin(in_stack_ffffffffffffffb8)
  ;
  (*(code *)in_RDI->_M_current[3]._states)();
  __last = std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::end(in_stack_ffffffffffffffb8);
  std::
  find<__gnu_cxx::__normal_iterator<libDAI::Var_const*,std::vector<libDAI::Var,std::allocator<libDAI::Var>>>,libDAI::Var>
            ((__normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
              )__first._M_current,
             (__normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
              )__last._M_current,in_stack_ffffffffffffffc8);
  (*(code *)in_RDI->_M_current[3]._states)();
  std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::begin(in_stack_ffffffffffffffb8);
  sVar1 = __gnu_cxx::operator-
                    (in_RDI,(__normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
                             *)in_stack_ffffffffffffffb8);
  return sVar1;
}

Assistant:

virtual size_t findVar( const Var & n ) const {
                size_t i = find( vars().begin(), vars().end(), n ) - vars().begin();
                assert( i != nrVars() );
                return i;
            }